

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cc
# Opt level: O3

void __thiscall
kratos::SSATransformFixVisitor::~SSATransformFixVisitor(SSATransformFixVisitor *this)

{
  (this->super_IRVisitor)._vptr_IRVisitor = (_func_int **)&PTR_visit_root_002a82e0;
  std::
  _Hashtable<kratos::IRNode_*,_kratos::IRNode_*,_std::allocator<kratos::IRNode_*>,_std::__detail::_Identity,_std::equal_to<kratos::IRNode_*>,_std::hash<kratos::IRNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&(this->super_IRVisitor).visited_._M_h);
  operator_delete(this,0x48);
  return;
}

Assistant:

void visit(Generator *gen) override {
        auto stmts = gen->get_all_stmts();
        for (auto const &stmt : stmts) {
            if (stmt->type() == StatementType::Block && stmt->has_attribute("ssa")) {
                auto blk_stmt = stmt->as<StmtBlock>();
                if (blk_stmt->block_type() == StatementBlockType::Combinational) {
                    process_always_comb(blk_stmt);
                }
            }
        }
    }